

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

MXFReader * __thiscall
AS_02::ACES::MXFReader::FillAncillaryResourceList
          (MXFReader *this,ResourceList_t *ancillary_resources)

{
  h__Reader *phVar1;
  ulong uVar2;
  list<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
  *in_RDX;
  ResourceList_t *ancillary_resources_local;
  MXFReader *this_local;
  
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__Reader_
                     ((mem_ptr *)
                      &(ancillary_resources->
                       super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
                       )._M_impl._M_node.super__List_node_base._M_prev);
  if (phVar1 != (h__Reader *)0x0) {
    phVar1 = ASDCP::mem_ptr<AS_02::ACES::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::ACES::MXFReader::h__Reader> *)
                        &(ancillary_resources->
                         super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
                         )._M_impl._M_node.super__List_node_base._M_prev);
    uVar2 = (**(code **)(*(long *)(phVar1->super_h__AS02Reader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = ASDCP::mem_ptr<AS_02::ACES::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::ACES::MXFReader::h__Reader> *)
                          &(ancillary_resources->
                           super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
                           )._M_impl._M_node.super__List_node_base._M_prev);
      std::__cxx11::
      list<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
      ::operator=(in_RDX,&phVar1->m_Anc_Resources);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFReader::FillAncillaryResourceList(AS_02::ACES::ResourceList_t &ancillary_resources) const
{

  if(m_Reader && m_Reader->m_File->IsOpen())
  {
    ancillary_resources = m_Reader->m_Anc_Resources;
    return RESULT_OK;
  }
  return RESULT_INIT;
}